

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall LTAircraft::UpdatePosition(LTAircraft *this,float param_1,int cycle)

{
  pointer pfVar1;
  double dVar2;
  bool bVar3;
  string *psVar4;
  ulong uVar5;
  string *psVar6;
  float fVar7;
  double dVar8;
  allocator<char> local_249;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  FDDynamicData dynCopy;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined8 local_108;
  int local_100;
  bool local_fc;
  Doc8643 *local_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string *local_d0;
  string *psStack_c8;
  pointer local_c0;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  if (currCycle.num != cycle) {
    NextCycle(cycle);
  }
  if ((this->super_Aircraft).bValid != true) {
    return;
  }
  if (dataRefs.bReInitAll != false) {
    return;
  }
  bVar3 = CalcPPos(this);
  if (bVar3) {
    if (this->bChangeModel == true) {
      ChangeModel(this);
    }
    XPMP2::Aircraft::SetLocation
              (&this->super_Aircraft,(this->ppos)._lat,(this->ppos)._lon,(this->ppos)._alt / 0.3048)
    ;
    dVar2 = (this->ppos)._pitch;
    dVar8 = (this->ppos)._roll;
    (this->super_Aircraft).drawInfo.roll = (float)(double)(-(ulong)!NAN(dVar8) & (ulong)dVar8);
    dVar8 = (this->ppos)._head + (this->corrAngle).val;
    (this->super_Aircraft).drawInfo.pitch = (float)(double)(-(ulong)!NAN(dVar2) & (ulong)dVar2);
    (this->super_Aircraft).drawInfo.heading = (float)(double)(-(ulong)!NAN(dVar8) & (ulong)dVar8);
    dVar8 = MovingParam::get(&this->gear);
    *(this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
     super__Vector_impl_data._M_start = (float)dVar8;
    dVar8 = MovingParam::get(&this->flaps);
    pfVar1 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1[2] = (float)dVar8;
    pfVar1[5] = (float)dVar8;
    dVar8 = MovingParam::get(&this->spoilers);
    pfVar1 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1[3] = (float)dVar8;
    pfVar1[4] = (float)dVar8;
    dVar8 = MovingParam::get(&this->reversers);
    (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = (float)dVar8;
    dVar8 = MovingParam::get(&this->reversers);
    pfVar1 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1[0xb] = (float)dVar8;
    if (((this->pDoc8643->classification)._M_string_length == 0) ||
       (1 < (byte)(*(this->pDoc8643->classification)._M_dataplus._M_p + 0xb9U))) {
      dVar8 = this->pMdl->PROP_RPM_MAX;
      dVar8 = (double)pfVar1[7] * dVar8 * 0.5 + dVar8 * 0.5;
    }
    else {
      dVar8 = this->pMdl->PROP_RPM_MAX;
    }
    XPMP2::Aircraft::SetEngineRotRpm(&this->super_Aircraft,(float)dVar8);
    pfVar1 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar7 = pfVar1[0x17];
    pfVar1[0x1a] = fVar7;
    pfVar1[0x1b] = fVar7 * 0.10471976;
    XPMP2::Aircraft::SetEngineRotAngle
              (&this->super_Aircraft,
               (float)currCycle.diffTime * (fVar7 / 60.0) * 360.0 + pfVar1[0x16]);
    while( true ) {
      pfVar1 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar7 = pfVar1[0x16];
      if (fVar7 < 360.0) break;
      XPMP2::Aircraft::SetEngineRotAngle(&this->super_Aircraft,fVar7 + -360.0);
    }
    pfVar1[0x19] = fVar7;
    dVar8 = MovingParam::get(&this->gearDeflection);
    (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = (float)dVar8;
    dVar8 = MovingParam::get(&this->tireRpm);
    fVar7 = (float)dVar8;
    pfVar1 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1[0x14] = fVar7;
    pfVar1[0x15] = fVar7 * 0.10471976;
    for (fVar7 = (float)currCycle.diffTime * (fVar7 / 60.0) * 360.0 + pfVar1[0x13]; 360.0 <= fVar7;
        fVar7 = fVar7 + -360.0) {
    }
    pfVar1[0x13] = fVar7;
    fVar7 = 0.0;
    if ((this->reversers).bIncrease == true) {
      fVar7 = (float)((this->reversers).timeFrom <= currCycle.simTime &&
                     currCycle.simTime <= (this->reversers).timeTo);
    }
    pfVar1[0x29] = fVar7;
    if (currCycle.num % 100 < 2) {
      LTFlightData::FDDynamicData::FDDynamicData(&dynCopy);
      bVar3 = LTFlightData::TryGetSafeCopy(this->fd,&dynCopy);
      if (bVar3) {
        (this->super_Aircraft).acRadar.mode = dynCopy.radar.mode;
        (this->super_Aircraft).acRadar.size = dynCopy.radar.size;
        (this->super_Aircraft).acRadar.code = dynCopy.radar.code;
      }
    }
    if ((this->phase == FPH_PARKED) ||
       (((dataRefs.bAINotOnGnd != 0 && (bVar3 = IsOnRwy(this), !bVar3)) && (this->phase == FPH_TAXI)
        ))) {
      (this->super_Aircraft).acRadar.mode = xpmpTransponderMode_Standby;
    }
    if (this->bSendNewInfoData == true) {
      dynCopy.radar.size = (long)&dynCopy.radar.mode;
      dynCopy.radar.code = 0;
      dynCopy.radar.mode = dynCopy.radar.mode & 0xffffff00;
      dynCopy.heading = (double)&dynCopy.vsi;
      dynCopy.spd = 0.0;
      dynCopy.vsi._0_1_ = 0;
      dynCopy.pChannel = (LTChannel *)&local_178;
      local_178._M_local_buf[0] = '\0';
      local_168._M_p = (pointer)&local_158;
      local_160 = 0;
      local_158._M_local_buf[0] = '\0';
      local_148._M_p = (pointer)&local_138;
      local_140 = 0;
      local_138._M_local_buf[0] = '\0';
      local_128._M_p = (pointer)&local_118;
      local_120 = 0;
      local_118._M_local_buf[0] = '\0';
      local_108._0_4_ = -1;
      local_108._4_4_ = -1;
      local_100 = 0;
      local_fc = false;
      local_f8 = (Doc8643 *)0x0;
      local_f0._M_p = (pointer)&local_e0;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      local_d0 = (string *)0x0;
      psStack_c8 = (string *)0x0;
      local_c0 = (pointer)0x0;
      local_b8._M_p = (pointer)&local_a8;
      local_b0 = 0;
      local_a8._M_local_buf[0] = '\0';
      local_98._M_p = (pointer)&local_88;
      local_90 = 0;
      local_88._M_local_buf[0] = '\0';
      local_78._M_p = (pointer)&local_68;
      local_70 = 0;
      local_68._M_local_buf[0] = '\0';
      local_58._M_p = (pointer)&local_48;
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      local_38._0_1_ = false;
      local_38._1_1_ = false;
      bVar3 = LTFlightData::TryGetSafeCopy(this->fd,(FDStaticData *)&dynCopy);
      if (bVar3) {
        strncpy((this->super_Aircraft).acInfoTexts.tailNum,(char *)dynCopy.radar.size,9);
        (this->super_Aircraft).acInfoTexts.tailNum[9] = '\0';
        strncpy((this->super_Aircraft).acInfoTexts.icaoAcType,(char *)dynCopy.pChannel,4);
        (this->super_Aircraft).acInfoTexts.icaoAcType[4] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,local_168._M_p,&local_249);
        strAtMost(&local_248,&local_1e8,0x27);
        strncpy((this->super_Aircraft).acInfoTexts.manufacturer,local_248._M_dataplus._M_p,0x27);
        (this->super_Aircraft).acInfoTexts.manufacturer[0x27] = '\0';
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,local_148._M_p,&local_249);
        strAtMost(&local_248,&local_208,0x27);
        strncpy((this->super_Aircraft).acInfoTexts.model,local_248._M_dataplus._M_p,0x27);
        (this->super_Aircraft).acInfoTexts.model[0x27] = '\0';
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_208);
        strncpy((this->super_Aircraft).acInfoTexts.icaoAirline,local_58._M_p,3);
        (this->super_Aircraft).acInfoTexts.icaoAirline[3] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,local_78._M_p,&local_249);
        strAtMost(&local_248,&local_228,0x27);
        strncpy((this->super_Aircraft).acInfoTexts.airline,local_248._M_dataplus._M_p,0x27);
        (this->super_Aircraft).acInfoTexts.airline[0x27] = '\0';
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_228);
        strncpy((this->super_Aircraft).acInfoTexts.flightNum,local_b8._M_p,9);
        psVar6 = psStack_c8;
        (this->super_Aircraft).acInfoTexts.flightNum[9] = '\0';
        uVar5 = (long)psStack_c8 - (long)local_d0;
        psVar4 = local_d0;
        if (psStack_c8 == local_d0) {
          psVar4 = &LTFlightData::FDStaticData::emptyStr_abi_cxx11_;
        }
        strncpy((this->super_Aircraft).acInfoTexts.aptFrom,(psVar4->_M_dataplus)._M_p,4);
        (this->super_Aircraft).acInfoTexts.aptFrom[4] = '\0';
        psVar6 = psVar6 + -1;
        if (uVar5 < 0x21) {
          psVar6 = &LTFlightData::FDStaticData::emptyStr_abi_cxx11_;
        }
        strncpy((this->super_Aircraft).acInfoTexts.aptTo,(psVar6->_M_dataplus)._M_p,4);
        (this->super_Aircraft).acInfoTexts.aptTo[4] = '\0';
      }
      LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)&dynCopy);
    }
    return;
  }
  return;
}

Assistant:

void LTAircraft::UpdatePosition (float, int cycle)
{
    try {
        // We (LT) don't get called anywhere else once per frame.
        // XPMP API calls directly for aircraft positions.
        // So we need to figure out our way if we are called the first time of a cycle
        if ( cycle != currCycle.num )            // new cycle!
            NextCycle(cycle);
        
        // object invalid (due to exceptions most likely), don't use anymore, don't call LT functions
        if (!IsValid() ||
            dataRefs.IsReInitAll())
            return;

#ifdef DEBUG
        gSelAcCalc = fd.bIsSelected = bIsSelected = (key() == dataRefs.GetSelectedAcKey());
#endif
        
        
        // *** Position ***
        if (!CalcPPos())
            return;
        
        // If needed update the chosen CSL model
        if (ShallUpdateModel())
            ChangeModel();
        
        // Set Position
        SetLocation(ppos.lat(), ppos.lon(), ppos.alt_ft());
        drawInfo.pitch   = float(nanToZero(GetPitch()));
        drawInfo.roll    = float(nanToZero(GetRoll()));
        drawInfo.heading = float(nanToZero(GetHeading()));
        
        // *** Configuration ***
        
        SetGearRatio((float)gear.get());                // gear
        SetFlapRatio((float)flaps.get());               // flaps, and slats the same
        SetSlatRatio(GetFlapRatio());
        SetSpoilerRatio((float)spoilers.get());         // spoilers, and speed brakes the same
        SetSpeedbrakeRatio(GetSpoilerRatio());
        SetReversDeployRatio((float)reversers.get());   // opening reversers
        SetThrustReversRatio((float)reversers.get());

        // for engine / prop rotation we derive a value based on flight model
        if (pDoc8643->hasRotor())
            SetEngineRotRpm(float(pMdl->PROP_RPM_MAX));
        else
            SetEngineRotRpm(float(pMdl->PROP_RPM_MAX/2 + GetThrustRatio() * pMdl->PROP_RPM_MAX/2));
        SetPropRotRpm(GetEngineRotRpm());
        
        // Make props and rotors move based on rotation speed and time passed since last cycle
        SetEngineRotAngle(GetEngineRotAngle() + RpmToDegree(GetEngineRotRpm(), currCycle.diffTime));

        while (GetEngineRotAngle() >= 360.0f)
            SetEngineRotAngle(GetEngineRotAngle() - 360.0f);
        SetPropRotAngle(GetEngineRotAngle());
        
        // Gear deflection - has an effect during touch-down only
        SetTireDeflection((float)gearDeflection.get());
        
        // Tire rotation similarly
        SetTireRotRpm((float)tireRpm.get());
        SetTireRotAngle(GetTireRotAngle() + RpmToDegree(GetTireRotRpm(), currCycle.diffTime));
        while (GetTireRotAngle() >= 360.0f)
            SetTireRotAngle(GetTireRotAngle() - 360.0f);

        // 'moment' of touch down?
        // (We use the reversers deploy time for this...that's 2s)
        SetTouchDown(reversers.isIncrease() && reversers.inMotion());
        
        // *** Radar ***
        
        // for radar 'calculation' we need some dynData
        // but radar doesn't change often...just only check every 100th cycle
        if ( currCycle.num % 100 <= 1 )
        {
            // fetch new data if available
            LTFlightData::FDDynamicData dynCopy;
            if ( fd.TryGetSafeCopy(dynCopy) )
            {
                // copy fresh radar data
                acRadar               = dynCopy.radar;
            }
        }
        
        // -> deactivate TCAS in some cases like parked or taxiing outside runway
        // (will be re-activated by the above code every 100th cycle)
        if (phase == FPH_PARKED ||
            (dataRefs.IsAINotOnGnd() && !IsOnRwy() && phase == FPH_TAXI))
            acRadar.mode = xpmpTransponderMode_Standby;

        // *** Informational Texts ***

        // Is there new data to send?
        if (ShallSendNewInfoData())
        {
            // fetch new data if available
            LTFlightData::FDStaticData statCopy;
            if (fd.TryGetSafeCopy(statCopy))
            {
                // copy data over to libxplanemp
                STRCPY_S     (acInfoTexts.tailNum,      statCopy.reg.c_str());
                STRCPY_S     (acInfoTexts.icaoAcType,   statCopy.acTypeIcao.c_str());
                STRCPY_ATMOST(acInfoTexts.manufacturer, statCopy.man.c_str());
                STRCPY_ATMOST(acInfoTexts.model,        statCopy.mdl.c_str());
                STRCPY_S     (acInfoTexts.icaoAirline,  statCopy.opIcao.c_str());
                STRCPY_ATMOST(acInfoTexts.airline,      statCopy.op.c_str());
                STRCPY_S     (acInfoTexts.flightNum,    statCopy.flight.c_str());
                STRCPY_S     (acInfoTexts.aptFrom,      statCopy.origin().c_str());
                STRCPY_S     (acInfoTexts.aptTo,        statCopy.dest().c_str());
            }
        }
        
        // Done, ie. in success case we return here
        return;
        
    } catch (const std::exception& e) {
        LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
    } catch (...) {}

    // for any kind of exception: don't use this object any more!
    SetInvalid();
}